

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O0

string * __thiscall MinVR::VRDataIndex::addData(VRDataIndex *this,string *key,VRString *value)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000198;
  string *in_stack_000001a0;
  VRDataIndex *in_stack_000001a8;
  string local_60 [32];
  string local_40 [64];
  
  std::__cxx11::string::string(local_40,in_RDX);
  std::__cxx11::string::string(local_60,in_RCX);
  addDataSpecialized<std::__cxx11::string,(MinVR::VRCORETYPE_ID)3>
            (in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string VRDataIndex::addData(const std::string &key, VRString value) {

  return addDataSpecialized<VRString, VRCORETYPE_STRING>(key, value);
}